

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  undefined8 uVar1;
  FileDescriptorProto *pFVar2;
  Syntax SVar3;
  int iVar4;
  uint32_t *puVar5;
  Arena *pAVar6;
  ulong uVar7;
  FileDescriptor *pFVar8;
  string *psVar9;
  Descriptor *this_00;
  DescriptorProto *proto_00;
  EnumDescriptor *this_01;
  EnumDescriptorProto *proto_01;
  ServiceDescriptor *this_02;
  ServiceDescriptorProto *proto_02;
  FieldDescriptor *this_03;
  FieldDescriptorProto *proto_03;
  FileOptions *pFVar10;
  FileOptions *pFVar11;
  int local_6c;
  int local_68;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  FileDescriptorProto *local_48;
  FileDescriptorProto *proto_local;
  FileDescriptor *this_local;
  FileDescriptorProto *local_30;
  string *local_28;
  FileDescriptorProto *local_20;
  int *local_18;
  FileDescriptorProto *local_10;
  
  local_48 = proto;
  proto_local = (FileDescriptorProto *)this;
  this_local = (FileDescriptor *)name_abi_cxx11_(this);
  local_30 = proto;
  puVar5 = internal::HasBits<1UL>::operator[](&proto->_has_bits_,0);
  pFVar8 = this_local;
  *puVar5 = *puVar5 | 1;
  pAVar6 = MessageLite::GetArenaForAllocation((MessageLite *)proto);
  internal::ArenaStringPtr::Set(&proto->name_,pFVar8,pAVar6);
  package_abi_cxx11_(this);
  uVar7 = std::__cxx11::string::empty();
  pFVar2 = local_48;
  if ((uVar7 & 1) == 0) {
    local_28 = package_abi_cxx11_(this);
    local_20 = pFVar2;
    puVar5 = internal::HasBits<1UL>::operator[](&pFVar2->_has_bits_,0);
    psVar9 = local_28;
    *puVar5 = *puVar5 | 2;
    pAVar6 = MessageLite::GetArenaForAllocation((MessageLite *)pFVar2);
    internal::ArenaStringPtr::Set(&pFVar2->package_,psVar9,pAVar6);
  }
  SVar3 = syntax(this);
  pFVar2 = local_48;
  if (SVar3 == SYNTAX_PROTO3) {
    SVar3 = syntax(this);
    _i_1 = SyntaxName(SVar3);
    local_10 = pFVar2;
    local_18 = &i_1;
    puVar5 = internal::HasBits<1UL>::operator[](&pFVar2->_has_bits_,0);
    *puVar5 = *puVar5 | 4;
    uVar1 = *(undefined8 *)local_18;
    pAVar6 = MessageLite::GetArenaForAllocation((MessageLite *)pFVar2);
    internal::ArenaStringPtr::Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
              (&pFVar2->syntax_,uVar1,pAVar6);
  }
  i_2 = 0;
  while( true ) {
    iVar4 = dependency_count(this);
    pFVar2 = local_48;
    if (iVar4 <= i_2) break;
    pFVar8 = dependency(this,i_2);
    psVar9 = name_abi_cxx11_(pFVar8);
    FileDescriptorProto::add_dependency(pFVar2,psVar9);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar4 = public_dependency_count(this);
    if (iVar4 <= i_3) break;
    FileDescriptorProto::add_public_dependency
              (local_48,*(int32_t *)(*(long *)(this + 0x48) + (long)i_3 * 4));
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    iVar4 = weak_dependency_count(this);
    if (iVar4 <= i_4) break;
    FileDescriptorProto::add_weak_dependency
              (local_48,*(int32_t *)(*(long *)(this + 0x50) + (long)i_4 * 4));
    i_4 = i_4 + 1;
  }
  i_5 = 0;
  while( true ) {
    iVar4 = message_type_count(this);
    if (iVar4 <= i_5) break;
    this_00 = message_type(this,i_5);
    proto_00 = FileDescriptorProto::add_message_type(local_48);
    Descriptor::CopyTo(this_00,proto_00);
    i_5 = i_5 + 1;
  }
  i_6 = 0;
  while( true ) {
    iVar4 = enum_type_count(this);
    if (iVar4 <= i_6) break;
    this_01 = enum_type(this,i_6);
    proto_01 = FileDescriptorProto::add_enum_type(local_48);
    EnumDescriptor::CopyTo(this_01,proto_01);
    i_6 = i_6 + 1;
  }
  local_68 = 0;
  while( true ) {
    iVar4 = service_count(this);
    if (iVar4 <= local_68) break;
    this_02 = service(this,local_68);
    proto_02 = FileDescriptorProto::add_service(local_48);
    ServiceDescriptor::CopyTo(this_02,proto_02);
    local_68 = local_68 + 1;
  }
  local_6c = 0;
  while( true ) {
    iVar4 = extension_count(this);
    if (iVar4 <= local_6c) break;
    this_03 = extension(this,local_6c);
    proto_03 = FileDescriptorProto::add_extension(local_48);
    FieldDescriptor::CopyTo(this_03,proto_03);
    local_6c = local_6c + 1;
  }
  pFVar10 = options(this);
  pFVar11 = FileOptions::default_instance();
  if (pFVar10 != pFVar11) {
    pFVar10 = FileDescriptorProto::mutable_options(local_48);
    pFVar11 = options(this);
    FileOptions::CopyFrom(pFVar10,pFVar11);
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());
  // TODO(liujisi): Also populate when syntax="proto2".
  if (syntax() == SYNTAX_PROTO3) proto->set_syntax(SyntaxName(syntax()));

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}